

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm_sse2.c
# Opt level: O0

void av1_lowbd_fwd_txfm2d_4x16_sse2
               (int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  int8_t iVar1;
  int8_t iVar2;
  transform_1d_sse2 p_Var3;
  transform_1d_sse2 p_Var4;
  int8_t *piVar5;
  int iVar6;
  int iVar7;
  byte in_CL;
  int in_EDX;
  int16_t *in_RDI;
  __m128i *buf;
  int i;
  int lr_flip;
  int ud_flip;
  transform_1d_sse2 row_txfm;
  transform_1d_sse2 col_txfm;
  int height;
  int width;
  int cos_bit_row;
  int cos_bit_col;
  int txh_idx;
  int txw_idx;
  int8_t *shift;
  __m128i buf1 [16];
  __m128i buf0 [16];
  __m128i *in_stack_fffffffffffffd88;
  __m128i *out;
  undefined4 in_stack_fffffffffffffd98;
  int in_stack_fffffffffffffda0;
  int in_stack_fffffffffffffda4;
  longlong local_228 [32];
  longlong local_128 [34];
  byte local_15;
  int local_14;
  int16_t *local_8;
  
  piVar5 = av1_fwd_txfm_shift_ls[0xd];
  local_15 = in_CL;
  local_14 = in_EDX;
  local_8 = in_RDI;
  iVar6 = get_txw_idx('\r');
  iVar7 = get_txh_idx('\r');
  iVar1 = av1_fwd_cos_bit_col[iVar6][iVar7];
  iVar2 = av1_fwd_cos_bit_row[iVar6][iVar7];
  p_Var3 = col_txfm8x16_arr[local_15];
  p_Var4 = row_txfm8x4_arr[local_15];
  get_flip_cfg(local_15,(int *)&stack0xfffffffffffffda4,(int *)&stack0xfffffffffffffda0);
  if (in_stack_fffffffffffffda4 == 0) {
    load_buffer_16bit_to_16bit_w4(local_8,local_14,(__m128i *)local_128,0x10);
  }
  else {
    load_buffer_16bit_to_16bit_w4_flip(local_8,local_14,(__m128i *)local_128,0x10);
  }
  round_shift_16bit((__m128i *)local_128,0x10,(int)*piVar5);
  (*p_Var3)((__m128i *)local_128,(__m128i *)local_128,iVar1);
  round_shift_16bit((__m128i *)local_128,0x10,(int)piVar5[1]);
  transpose_16bit_4x8(in_stack_fffffffffffffd88,(__m128i *)0xb2f706);
  transpose_16bit_4x8(in_stack_fffffffffffffd88,(__m128i *)0xb2f726);
  for (iVar6 = 0; iVar6 < 2; iVar6 = iVar6 + 1) {
    if (in_stack_fffffffffffffda0 == 0) {
      out = (__m128i *)(local_228 + (long)(iVar6 << 3) * 2);
    }
    else {
      out = (__m128i *)local_128;
      flip_buf_sse2((__m128i *)(local_228 + (long)(iVar6 << 3) * 2),out,4);
    }
    (*p_Var4)(out,out,iVar2);
    round_shift_16bit(out,4,(int)piVar5[2]);
    store_buffer_16bit_to_32bit_w8
              ((__m128i *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
               (int32_t *)CONCAT44(iVar6,in_stack_fffffffffffffd98),(int)((ulong)out >> 0x20),
               (int)out);
  }
  return;
}

Assistant:

void av1_lowbd_fwd_txfm2d_4x16_sse2(const int16_t *input, int32_t *output,
                                    int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  __m128i buf0[16], buf1[16];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_4X16];
  const int txw_idx = get_txw_idx(TX_4X16);
  const int txh_idx = get_txh_idx(TX_4X16);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = 4;
  const int height = 16;
  const transform_1d_sse2 col_txfm = col_txfm8x16_arr[tx_type];
  const transform_1d_sse2 row_txfm = row_txfm8x4_arr[tx_type];
  int ud_flip, lr_flip;

  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  if (ud_flip) {
    load_buffer_16bit_to_16bit_w4_flip(input, stride, buf0, height);
  } else {
    load_buffer_16bit_to_16bit_w4(input, stride, buf0, height);
  }
  round_shift_16bit(buf0, height, shift[0]);
  col_txfm(buf0, buf0, cos_bit_col);
  round_shift_16bit(buf0, height, shift[1]);
  transpose_16bit_4x8(buf0, buf1);
  transpose_16bit_4x8(buf0 + 8, buf1 + 8);

  for (int i = 0; i < 2; i++) {
    __m128i *buf;
    if (lr_flip) {
      buf = buf0;
      flip_buf_sse2(buf1 + 8 * i, buf, width);
    } else {
      buf = buf1 + 8 * i;
    }
    row_txfm(buf, buf, cos_bit_row);
    round_shift_16bit(buf, width, shift[2]);
    store_buffer_16bit_to_32bit_w8(buf, output + 8 * i, height, width);
  }
}